

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O1

void __thiscall XMISong::DoRestart(XMISong *this)

{
  TrackInfo *pTVar1;
  ulong uVar2;
  uint uVar3;
  EventSource EVar4;
  ulong uVar5;
  uint uVar6;
  
  pTVar1 = this->CurrSong;
  pTVar1->EventP = 0;
  pTVar1->Finished = false;
  uVar6 = 0;
  pTVar1->PlayedTime = 0;
  pTVar1->ForDepth = 0;
  if ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count != 0) {
    (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count = 0;
  }
  ProcessInitialMetaEvents(this);
  pTVar1 = this->CurrSong;
  if (pTVar1->EventP < pTVar1->EventLen) {
    uVar6 = 0;
    uVar2 = pTVar1->EventP;
    do {
      uVar5 = uVar2 + 1;
      if ((char)pTVar1->EventChunk[uVar2] < '\0') break;
      uVar6 = uVar6 + (int)(char)pTVar1->EventChunk[uVar2];
      pTVar1->EventP = uVar5;
      uVar2 = uVar5;
    } while (uVar5 != pTVar1->EventLen);
  }
  pTVar1->Delay = uVar6;
  uVar3 = (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count;
  EVar4 = EVENT_None;
  if ((pTVar1->Finished & uVar3 == 0) == 0) {
    if (uVar3 == 0) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array)->Delay;
    }
    EVar4 = (byte)(pTVar1->Finished | uVar3 <= uVar6) + EVENT_Real;
  }
  this->EventDue = EVar4;
  return;
}

Assistant:

void XMISong::DoRestart()
{
	CurrSong->EventP = 0;
	CurrSong->Finished = false;
	CurrSong->PlayedTime = 0;
	CurrSong->ForDepth = 0;
	NoteOffs.Clear();

	ProcessInitialMetaEvents ();

	CurrSong->Delay = CurrSong->ReadDelay();
	EventDue = FindNextDue();
}